

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * __thiscall minja::Value::at(Value *this,Value *index)

{
  element_type *peVar1;
  pointer pVVar2;
  ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
  *this_00;
  int iVar3;
  Value *pVVar4;
  runtime_error *prVar5;
  ulong uVar6;
  ulong uVar7;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((((index->array_).
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) &&
      ((index->object_).
       super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr == (element_type *)0x0)) &&
     ((index->callable_).
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    peVar1 = (this->array_).
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      this_00 = (this->object_).
                super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (this_00 !=
          (ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
           *)0x0) {
        pVVar4 = nlohmann::json_abi_v3_11_3::
                 ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>
                 ::at(this_00,&index->primitive_);
        return pVVar4;
      }
    }
    else {
      iVar3 = get<int>(index);
      uVar7 = (ulong)iVar3;
      pVVar2 = (peVar1->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(peVar1->super__Vector_base<minja::Value,_std::allocator<minja::Value>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4) *
              -0x3333333333333333;
      if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
        return pVVar2 + uVar7;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    dump_abi_cxx11_(&sStack_58,this,-1,false);
    std::operator+(&local_38,"Value is not an array or object: ",&sStack_58);
    std::runtime_error::runtime_error(prVar5,(string *)&local_38);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  dump_abi_cxx11_(&sStack_58,this,-1,false);
  std::operator+(&local_38,"Unashable type: ",&sStack_58);
  std::runtime_error::runtime_error(prVar5,(string *)&local_38);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value& at(const Value & index) {
    if (!index.is_hashable()) throw std::runtime_error("Unashable type: " + dump());
    if (is_array()) return array_->at(index.get<int>());
    if (is_object()) return object_->at(index.primitive_);
    throw std::runtime_error("Value is not an array or object: " + dump());
  }